

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O0

string * slang::OS::parseEnvVar_abi_cxx11_(char **ptr,char *end)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  long in_RDX;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string varName_1;
  string varName;
  char endDelim;
  char startDelim;
  char c;
  char in_stack_fffffffffffffeff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  char local_e1;
  _Alloc_hider in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  
  pcVar2 = (char *)*in_RSI;
  *in_RSI = (long)(pcVar2 + 1);
  cVar1 = *pcVar2;
  if ((cVar1 == '(') || (cVar1 == '{')) {
    local_e1 = ')';
    if (cVar1 != '(') {
      local_e1 = '}';
    }
    std::__cxx11::string::string(in_RDI);
    while (*in_RSI != in_RDX) {
      pcVar2 = (char *)*in_RSI;
      *in_RSI = (long)(pcVar2 + 1);
      if (*pcVar2 == local_e1) {
        getEnv(in_stack_ffffffffffffff38);
        goto LAB_002c4d4a;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
    }
    s_abi_cxx11_((char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30._M_p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
                   (char)((ulong)in_stack_ffffffffffffff00 >> 0x38));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
                   in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
LAB_002c4d4a:
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  }
  else {
    pbVar4 = in_RDI;
    bVar3 = isValidCIdChar('\0');
    if (bVar3) {
      std::__cxx11::string::string(pbVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
      while( true ) {
        bVar3 = false;
        if (*in_RSI != in_RDX) {
          bVar3 = isValidCIdChar('\0');
        }
        if (bVar3 == false) break;
        *in_RSI = *in_RSI + 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
      }
      getEnv(in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff30;
      s_abi_cxx11_((char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30._M_p);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff0f,
                              CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
                     (char)((ulong)pbVar4 >> 0x38));
      std::__cxx11::string::~string(pbVar4);
    }
  }
  return in_RDI;
}

Assistant:

std::string OS::parseEnvVar(const char*& ptr, const char* end) {
    // Three forms for environment variables to try:
    // $VAR
    // $(VAR)
    // ${VAR}
    char c = *ptr++;
    if (c == '(' || c == '{') {
        char startDelim = c;
        char endDelim = c == '(' ? ')' : '}';
        std::string varName;
        while (ptr != end) {
            c = *ptr++;
            if (c == endDelim)
                return OS::getEnv(varName);

            varName += c;
        }

        // If we reach the end, we didn't find a closing delimiter.
        // Don't try to expand, just return the whole thing we collected.
        return "$"s + startDelim + varName;
    }
    else if (isValidCIdChar(c)) {
        std::string varName;
        varName += c;
        while (ptr != end && isValidCIdChar(*ptr))
            varName += *ptr++;

        return OS::getEnv(varName);
    }
    else {
        // This is not a possible variable name so just return what we have.
        return "$"s + c;
    }
}